

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O0

void __thiscall
dlib::add_prev_<dlib::tag1>::
forward<dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<1024l,1l,1l,1,1,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<256l,3l,3l,1,1,1,1>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<256l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,void>,void>,void>,void>,void>,void>,void>,void>,true,void>>
          (add_prev_<dlib::tag1> *this,
          subnet_wrapper<dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
          *sub,resizable_tensor *output)

{
  longlong *plVar1;
  resizable_tensor *this_00;
  longlong n_;
  tensor *in_RDX;
  tensor *t2;
  tensor *t1;
  tensor *dest;
  longlong nr_;
  longlong k_;
  longlong local_58;
  longlong local_50;
  longlong local_48;
  longlong local_40;
  longlong local_38;
  longlong local_30;
  tensor *local_28;
  tensor *local_20;
  tensor *local_18;
  
  local_18 = in_RDX;
  local_20 = dimpl::
             subnet_wrapper<dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
             ::get_output((subnet_wrapper<dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
                           *)0x1f20c3);
  layer<dlib::tag1,dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<1024l,1l,1l,1,1,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<256l,3l,3l,1,1,1,1>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<256l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,void>,void>,void>,void>,void>,void>,void>,void>,true,void>const>
            ((subnet_wrapper<dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
              *)0x1f20d2);
  local_28 = dimpl::
             subnet_wrapper<dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_false,_void>
             ::get_output((subnet_wrapper<dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_false,_void>
                           *)0x1f20da);
  local_30 = tensor::num_samples(local_20);
  local_38 = tensor::num_samples(local_28);
  plVar1 = std::max<long_long>(&local_30,&local_38);
  dest = (tensor *)*plVar1;
  local_40 = tensor::k(local_20);
  local_48 = tensor::k(local_28);
  plVar1 = std::max<long_long>(&local_40,&local_48);
  nr_ = *plVar1;
  local_50 = tensor::nr(local_20);
  local_58 = tensor::nr(local_28);
  plVar1 = std::max<long_long>(&local_50,&local_58);
  k_ = *plVar1;
  this_00 = (resizable_tensor *)tensor::nc(local_20);
  n_ = tensor::nc(local_28);
  std::max<long_long>((longlong *)&stack0xffffffffffffffa0,(longlong *)&stack0xffffffffffffff98);
  resizable_tensor::set_size(this_00,n_,k_,nr_,(longlong)dest);
  tt::add(dest,local_18,(tensor *)0x1f21e3);
  return;
}

Assistant:

void forward(const SUBNET& sub, resizable_tensor& output)
        {
            auto&& t1 = sub.get_output();
            auto&& t2 = layer<tag>(sub).get_output();
            output.set_size(std::max(t1.num_samples(),t2.num_samples()),
                            std::max(t1.k(),t2.k()),
                            std::max(t1.nr(),t2.nr()),
                            std::max(t1.nc(),t2.nc()));
            tt::add(output, t1, t2);
        }